

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

DeviceState __thiscall molly::Device::sample(Device *this)

{
  MollyError *pMVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  string local_568 [32];
  stringstream local_548 [8];
  stringstream msg_2;
  ostream local_538 [383];
  undefined1 local_3b9;
  string local_3b8 [32];
  stringstream local_398 [8];
  stringstream msg_1;
  ostream local_388 [382];
  byte local_20a [2];
  string local_208 [6];
  uchar code;
  stringstream local_1e8 [8];
  stringstream msg;
  ostream local_1d8 [376];
  ssize_t local_60;
  ssize_t res;
  char buf [8];
  allocator local_39;
  string local_38 [32];
  Device *local_18;
  Device *this_local;
  
  local_18 = this;
  if (this->_fd == -1) {
    buf[0] = '\x01';
    pMVar1 = (MollyError *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Device not yet open",&local_39);
    MollyError::MollyError(pMVar1,(string *)local_38);
    buf[0] = '\0';
    __cxa_throw(pMVar1,&MollyError::typeinfo,MollyError::~MollyError);
  }
  stack0xffffffffffffffab = 0x200000000000008;
  local_60 = write(this->_fd,(void *)((long)&res + 3),8);
  if (local_60 < 0) {
    std::__cxx11::stringstream::stringstream(local_1e8);
    poVar2 = std::operator<<(local_1d8,"Error writing to device: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    local_20a[1] = 1;
    pMVar1 = (MollyError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    MollyError::MollyError(pMVar1,local_208);
    local_20a[1] = 0;
    __cxa_throw(pMVar1,&MollyError::typeinfo,MollyError::~MollyError);
  }
  local_60 = read(this->_fd,local_20a,1);
  if (local_60 == 1) {
    if (local_20a[0] == 0x15) {
      this_local._4_4_ = LidClosed;
    }
    else if (local_20a[0] == 0x16) {
      this_local._4_4_ = ButtonPressed;
    }
    else {
      if (local_20a[0] != 0x17) {
        std::__cxx11::stringstream::stringstream(local_548);
        poVar2 = std::operator<<(local_538,"Unexpected response: ");
        std::ostream::operator<<(poVar2,(uint)local_20a[0]);
        pMVar1 = (MollyError *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringstream::str();
        MollyError::MollyError(pMVar1,local_568);
        __cxa_throw(pMVar1,&MollyError::typeinfo,MollyError::~MollyError);
      }
      this_local._4_4_ = LidOpen;
    }
  }
  else {
    piVar3 = __errno_location();
    if (*piVar3 != 0xb) {
      std::__cxx11::stringstream::stringstream(local_398);
      poVar2 = std::operator<<(local_388,"Error reading from device: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      std::operator<<(poVar2,pcVar4);
      local_3b9 = 1;
      pMVar1 = (MollyError *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      MollyError::MollyError(pMVar1,local_3b8);
      local_3b9 = 0;
      __cxa_throw(pMVar1,&MollyError::typeinfo,MollyError::~MollyError);
    }
    this_local._4_4_ = Unavailable;
  }
  return this_local._4_4_;
}

Assistant:

DeviceState Device::sample()
{
  if (_fd == INVALID_FD)
    throw MollyError("Device not yet open");

  char buf[8] = {0x08, 0, 0, 0, 0, 0, 0, 0x02 };

  ssize_t res = ::write(_fd, buf, 8);

  if (res < 0)
  {
    stringstream msg;
    msg << "Error writing to device: " << strerror(errno);
    throw MollyError(msg.str());
  }

  unsigned char code;
  res = read(_fd, &code, 1);

  if (res != 1)
  {
    if (errno == EAGAIN)
      return DeviceState::Unavailable;

    stringstream msg;
    msg << "Error reading from device: " << strerror(errno);
    throw MollyError(msg.str());
  }

  switch (code)
  {
    case (unsigned char)DeviceState::ButtonPressed:
      return DeviceState::ButtonPressed;
    case (unsigned char)DeviceState::LidClosed:
      return DeviceState::LidClosed;
    case (unsigned char)DeviceState::LidOpen:
      return DeviceState::LidOpen;
    default:
      stringstream msg;
      msg << "Unexpected response: " << (int)code;
      throw MollyError(msg.str());
  }
}